

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O3

int __thiscall uv::TCPClient::Send(TCPClient *this,char *data,size_t len)

{
  char *__s;
  long lVar1;
  pointer pcVar2;
  uint uVar3;
  uint uVar4;
  ILog4zManager *pIVar5;
  ssize_t sVar6;
  undefined8 in_RCX;
  size_t __n;
  ulong uVar7;
  char *pcVar8;
  long *in_FS_OFFSET;
  long *local_50 [2];
  long local_40 [2];
  
  __n = CONCAT71((int7)((ulong)in_RCX >> 8),len != 0);
  if (data != (char *)0x0 && len != 0) {
    uv_async_send(&this->async_handle_);
    uVar7 = 0;
    if (this->isuseraskforclosed_ == false) {
      uVar7 = 0;
      do {
        uv_mutex_lock(&this->mutex_writebuf_);
        sVar6 = PodCircularBuffer<char>::write
                          (&this->write_circularbuf_,(int)data + (int)uVar7,
                           (void *)(ulong)(uint)((int)len - (int)uVar7),__n);
        uVar7 = (long)(int)sVar6 + uVar7;
        uv_mutex_unlock(&this->mutex_writebuf_);
        if (len <= uVar7) break;
        usleep(100000);
      } while (this->isuseraskforclosed_ != true);
    }
    uv_async_send(&this->async_handle_);
    return (int)uVar7;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->errmsg_,0,(char *)(this->errmsg_)._M_string_length,0x1311f8);
  lVar1 = *in_FS_OFFSET;
  __s = (char *)(lVar1 + -0x800);
  pcVar2 = (this->errmsg_)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (this->errmsg_)._M_string_length);
  uVar3 = snprintf(__s,0x800,"%s",local_50[0]);
  pcVar8 = __s;
  uVar4 = 0;
  if ((int)uVar3 < 0) {
LAB_0011aa7a:
    uVar3 = uVar4;
    *pcVar8 = '\0';
  }
  else if (0x7ff < uVar3) {
    pcVar8 = (char *)(lVar1 + -1);
    uVar4 = 0x800;
    goto LAB_0011aa7a;
  }
  uVar7 = (ulong)uVar3;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (uVar3 < 0x800) {
    pcVar8 = __s + uVar7;
    uVar3 = snprintf(pcVar8,0x800 - uVar7,"%s"," ( ");
    uVar4 = 0;
    if ((int)uVar3 < 0) {
LAB_0011aae0:
      uVar3 = uVar4;
      *pcVar8 = '\0';
    }
    else {
      uVar4 = (uint)(0x800 - uVar7);
      if (uVar4 <= uVar3) {
        pcVar8 = (char *)(lVar1 + -1);
        goto LAB_0011aae0;
      }
    }
    uVar7 = uVar7 + uVar3;
  }
  if (0x7ff < uVar7) goto LAB_0011abdb;
  pcVar8 = __s + uVar7;
  uVar3 = snprintf(pcVar8,0x800 - uVar7,"%s"," ");
  uVar4 = 0;
  if ((int)uVar3 < 0) {
LAB_0011ab35:
    uVar3 = uVar4;
    *pcVar8 = '\0';
  }
  else {
    uVar4 = (uint)(0x800 - uVar7);
    if (uVar4 <= uVar3) {
      pcVar8 = (char *)(lVar1 + -1);
      goto LAB_0011ab35;
    }
  }
  uVar7 = uVar7 + uVar3;
  if (0x7ff < uVar7) goto LAB_0011abdb;
  pcVar8 = __s + uVar7;
  uVar3 = snprintf(pcVar8,0x800 - uVar7,"%s"," ) : ");
  uVar4 = 0;
  if ((int)uVar3 < 0) {
LAB_0011ab8a:
    uVar3 = uVar4;
    *pcVar8 = '\0';
  }
  else {
    uVar4 = (uint)(0x800 - uVar7);
    if (uVar4 <= uVar3) {
      pcVar8 = (char *)(lVar1 + -1);
      goto LAB_0011ab8a;
    }
  }
  uVar7 = uVar7 + uVar3;
  if (uVar7 < 0x800) {
    pcVar8 = __s + uVar7;
    uVar4 = snprintf(pcVar8,0x800 - uVar7,"%d",0x131);
    if (-1 < (int)uVar4) {
      if (uVar4 < (uint)(0x800 - uVar7)) goto LAB_0011abdb;
      pcVar8 = (char *)(lVar1 + -1);
    }
    *pcVar8 = '\0';
  }
LAB_0011abdb:
  pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,3,__s);
  return 0;
}

Assistant:

int TCPClient::Send(const char* data, std::size_t len)
{
    if (!data || len <= 0) {
        errmsg_ = "send data is null or len less than zero.";
        LOGE(errmsg_);
        return 0;
    }
    uv_async_send(&async_handle_);
    size_t iret = 0;
    while (!isuseraskforclosed_) {
        uv_mutex_lock(&mutex_writebuf_);
        iret += write_circularbuf_.write(data + iret, len - iret);
        uv_mutex_unlock(&mutex_writebuf_);
        if (iret < len) {
            ThreadSleep(100);
            continue;
        } else {
            break;
        }
    }
    uv_async_send(&async_handle_);
    return iret;
}